

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lest_cpp03.hpp
# Opt level: O3

string * __thiscall lest::to_string_abi_cxx11_(string *__return_storage_ptr__,lest *this,char *chr)

{
  size_type sVar1;
  long *plVar2;
  long *plVar3;
  ulong *puVar4;
  ulong *puVar5;
  ulong local_88;
  long lStack_80;
  long *local_78;
  long local_70;
  long local_68;
  long lStack_60;
  string local_58;
  string local_38;
  
  local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
  std::__cxx11::string::_M_construct((ulong)&local_58,'\x01');
  make_tran_string(&local_38,&local_58);
  plVar2 = (long *)std::__cxx11::string::replace((ulong)&local_38,0,(char *)0x0,0x1c9481);
  plVar3 = plVar2 + 2;
  if ((long *)*plVar2 == plVar3) {
    local_68 = *plVar3;
    lStack_60 = plVar2[3];
    local_78 = &local_68;
  }
  else {
    local_68 = *plVar3;
    local_78 = (long *)*plVar2;
  }
  local_70 = plVar2[1];
  *plVar2 = (long)plVar3;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  plVar2 = (long *)std::__cxx11::string::append((char *)&local_78);
  puVar5 = (ulong *)(plVar2 + 2);
  if ((ulong *)*plVar2 == puVar5) {
    local_88 = *puVar5;
    lStack_80 = plVar2[3];
    puVar4 = &local_88;
  }
  else {
    local_88 = *puVar5;
    puVar4 = (ulong *)*plVar2;
  }
  sVar1 = plVar2[1];
  *plVar2 = (long)puVar5;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  if (puVar4 == &local_88) {
    (__return_storage_ptr__->field_2)._M_allocated_capacity = local_88;
    *(long *)((long)&__return_storage_ptr__->field_2 + 8) = lStack_80;
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)puVar4;
    (__return_storage_ptr__->field_2)._M_allocated_capacity = local_88;
  }
  __return_storage_ptr__->_M_string_length = sVar1;
  local_88 = local_88 & 0xffffffffffffff00;
  if (local_78 != &local_68) {
    operator_delete(local_78);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != &local_38.field_2) {
    operator_delete(local_38._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != &local_58.field_2) {
    operator_delete(local_58._M_dataplus._M_p);
  }
  return __return_storage_ptr__;
}

Assistant:

inline std::string to_string(          char  const & chr ) { return  "'" + make_tran_string( std::string( 1, chr ) ) +  "'"; }